

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_one<(libdivide::Branching)0>
          (DivideTest<long> *this,long numer,long denom,
          divider<long,_(libdivide::Branching)0> *the_divider)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long result;
  long expect;
  int64_t q_1;
  int64_t sign_1;
  uint64_t uq_1;
  int64_t sign;
  int64_t q;
  uint64_t uq;
  uint64_t mask;
  uint8_t shift;
  __int128_t rl;
  __int128_t yl;
  __int128_t xl;
  int in_stack_fffffffffffffec4;
  DivideTest<long> *in_stack_fffffffffffffec8;
  string local_130 [32];
  long local_110;
  long local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  ulong *local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong *local_c8;
  ulong local_c0;
  ulong *local_b8;
  ulong *local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  byte local_62;
  byte local_61;
  ulong local_60;
  ulong local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  ulong local_38;
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_10;
  ulong local_8;
  
  local_100 = in_RCX;
  local_f8 = in_RDX;
  local_f0 = in_RSI;
  uVar3 = std::numeric_limits<long>::min();
  if ((in_RSI != uVar3) || (local_f8 != -1)) {
    local_108 = (long)local_f0 / local_f8;
    local_d8 = local_f0;
    local_e0 = local_100;
    local_c8 = local_100;
    local_d0 = local_f0;
    local_b8 = local_100;
    local_c0 = local_f0;
    local_a8 = local_f0;
    local_b0 = local_100;
    local_60 = *local_100;
    local_61 = (byte)local_100[1];
    local_58 = local_f0;
    local_62 = local_61 & 0x3f;
    uVar3 = (long)local_f0 >> 0x3f;
    if (local_60 == 0) {
      local_70 = (1L << local_62) - 1;
      local_78 = local_f0 + (uVar3 & local_70);
      local_88 = (ulong)((int)(char)local_61 >> 7);
      local_80 = (local_78 >> local_62 ^ local_88) - local_88;
      local_50 = local_80;
    }
    else {
      local_8 = local_f0;
      local_28 = local_f0;
      local_30 = (long)local_60 >> 0x3f;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_f0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_60;
      local_48 = SUB168(auVar1 * auVar2,0);
      local_40 = SUB168(auVar1 * auVar2,8) + local_f0 * local_30 + uVar3 * local_60;
      local_90 = local_40;
      if ((local_61 & 0x40) != 0) {
        local_98 = (ulong)((int)(char)local_61 >> 7);
        local_90 = ((local_f0 ^ local_98) - local_98) + local_40;
      }
      local_a0 = (ulong)(local_90 >> local_62 < 0) + (local_90 >> local_62);
      local_50 = local_a0;
      local_38 = local_60;
      local_20 = uVar3;
      local_10 = local_60;
    }
    local_110 = local_50;
    if (local_50 != local_108) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      std::operator<<((ostream *)&std::cerr,local_130);
      std::__cxx11::string::~string(local_130);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,local_f0);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,local_f8);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,local_108);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,local_110);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }